

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void close_elevator(ROOM_INDEX_DATA *pRoom)

{
  int iVar1;
  long in_RDI;
  char mmsg [40];
  ROOM_INDEX_DATA *toRoom;
  int i;
  void *in_stack_ffffffffffffffa8;
  void *pvVar2;
  void *in_stack_ffffffffffffffb0;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  int local_c;
  
  memcpy(&stack0xffffffffffffffb8,"The lift doors close with a loud clang.",0x28);
  for (local_c = 0; local_c < 6; local_c = local_c + 1) {
    if ((*(long *)(in_RDI + 0x38 + (long)local_c * 8) != 0) &&
       (**(long **)(in_RDI + 0x38 + (long)local_c * 8) != 0)) {
      act(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
          in_stack_ffffffffffffffa8,0);
      act(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
          in_stack_ffffffffffffffa8,0);
      pvVar2 = (void *)**(undefined8 **)(in_RDI + 0x38 + (long)local_c * 8);
      in_stack_ffffffffffffffb0 = pvVar2;
      iVar1 = reverse_d(local_c);
      if (**(long **)((long)in_stack_ffffffffffffffb0 + (long)iVar1 * 8 + 0x38) != 0) {
        iVar1 = reverse_d(local_c);
        **(undefined8 **)((long)pvVar2 + (long)iVar1 * 8 + 0x38) = 0;
        in_stack_ffffffffffffffa8 = pvVar2;
      }
      **(undefined8 **)(in_RDI + 0x38 + (long)local_c * 8) = 0;
    }
  }
  return;
}

Assistant:

void close_elevator(ROOM_INDEX_DATA *pRoom)
{
	int i;
	ROOM_INDEX_DATA *toRoom;
	const char mmsg[] = "The lift doors close with a loud clang.";

	for (i = 0; i < MAX_DIR; i++)
	{
		if (pRoom->exit[i] && pRoom->exit[i]->u1.to_room)
		{
			act(mmsg, pRoom->exit[i]->u1.to_room->people, 0, 0, TO_ALL);
			act(mmsg, pRoom->people, 0, 0, TO_ALL);

			toRoom = pRoom->exit[i]->u1.to_room;

			if (toRoom->exit[reverse_d(i)]->u1.to_room)
				toRoom->exit[reverse_d(i)]->u1.to_room = nullptr;

			pRoom->exit[i]->u1.to_room = nullptr;
		}
	}
}